

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void menu(bool *bots,bool *player1,bool *player2)

{
  bool bVar1;
  ostream *poVar2;
  bool local_62;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string num;
  bool *player2_local;
  bool *player1_local;
  bool *bots_local;
  
  num.field_2._8_8_ = player2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"0",&local_41);
  std::allocator<char>::~allocator(&local_41);
  while( true ) {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"1");
    local_62 = false;
    if (bVar1) {
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"2");
      local_62 = false;
      if (bVar1) {
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"3");
        local_62 = false;
        if (bVar1) {
          local_62 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_40,"4");
        }
      }
    }
    if (local_62 == false) break;
    system("clear");
    poVar2 = std::operator<<((ostream *)&std::cout,"********(");
    poVar2 = std::operator<<(poVar2,"MENU");
    poVar2 = std::operator<<(poVar2,")********");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"1.alone bots");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"2.one player by bots");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"3.two player");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"4.two player by bots");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"**********************");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"Select the number you want : ");
    std::operator>>((istream *)&std::cin,(string *)local_40);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"1");
    if (((bVar1) ||
        (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_40,"2"), bVar1)) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"4"), bVar1)) {
      *bots = true;
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"2");
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,"4"), bVar1)) {
        *player1 = true;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"4");
      if (bVar1) {
        *(undefined1 *)num.field_2._8_8_ = 1;
      }
    }
    else {
      *player1 = true;
      *(undefined1 *)num.field_2._8_8_ = 1;
    }
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void menu(bool& bots, bool& player1, bool& player2)
{
    string num = "0"; 
    while(num != "1" and num != "2" and num != "3" and num != "4") 
    { 
        system("clear"); 
        cout << "********(" << "MENU" << ")********" << endl; 
        cout << "1.alone bots" << endl; 
        cout << "2.one player by bots" << endl; 
        cout << "3.two player" << endl; 
        cout << "4.two player by bots" << endl; 
        cout << "**********************" << endl; 
        cout << "Select the number you want : "; 

        cin >> num; 

		if(num == "1" or num == "2" or num == "4")
		{
			bots = true;
			if(num == "2" or num == "4")
				player1 = true;
			if(num == "4")
				player2 = true;
		}
		else
		{
			player1 = true;	
			player2 = true;
		}
	}
}